

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vepu1_v2.c
# Opt level: O0

MPP_RET hal_jpege_vepu1_wait(void *hal,HalEncTask *task)

{
  uint uVar1;
  JpegeBits ctx_00;
  long lVar2;
  uint uVar3;
  RK_U32 hw_bit;
  RK_U32 sw_bit;
  RK_U32 val;
  JpegeFeedback *feedback;
  RK_U32 *regs;
  JpegeBits bits;
  HalJpegeCtx *ctx;
  MPP_RET ret;
  HalEncTask *task_local;
  void *hal_local;
  
  ctx._4_4_ = MPP_OK;
  ctx_00 = *(JpegeBits *)((long)hal + 0x10);
  lVar2 = *(long *)((long)hal + 0x18);
  if ((hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu1","enter hal %p\n","hal_jpege_vepu1_wait",hal);
  }
  if ((*hal != 0) && (ctx._4_4_ = mpp_dev_ioctl(*hal,0x10,(void *)0x0), ctx._4_4_ != MPP_OK)) {
    _mpp_log_l(2,"hal_jpege_vepu1","poll cmd failed %d\n","hal_jpege_vepu1_wait",
               (ulong)(uint)ctx._4_4_);
  }
  uVar1 = *(uint *)(lVar2 + 4);
  if ((hal_jpege_debug & 0x20) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu1","hw_status %08x\n",(char *)0x0,(ulong)uVar1);
  }
  *(uint *)((long)hal + 0xf8) = uVar1 & 0x70;
  uVar1 = *(uint *)(lVar2 + 0x60);
  uVar3 = jpege_bits_get_bitpos(ctx_00);
  *(uint *)((long)hal + 0xfc) = (uVar3 >> 3 & 0xfffffff8) + (uVar1 >> 3);
  task->length = *(RK_U32 *)((long)hal + 0xfc);
  task->hw_length = task->length - *(int *)((long)hal + 0x150);
  if ((hal_jpege_debug & 0x20) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu1","stream bit: sw %d hw %d total %d hw_length %d\n",(char *)0x0,
               (ulong)uVar3,(ulong)uVar1,*(undefined4 *)((long)hal + 0xfc),task->hw_length);
  }
  if ((hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu1","leave hal %p\n","hal_jpege_vepu1_wait",hal);
  }
  return ctx._4_4_;
}

Assistant:

static MPP_RET hal_jpege_vepu1_wait(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    HalJpegeCtx *ctx = (HalJpegeCtx *)hal;
    JpegeBits bits = ctx->bits;
    RK_U32 *regs = (RK_U32 *)ctx->regs;
    JpegeFeedback *feedback = &ctx->feedback;
    RK_U32 val;
    RK_U32 sw_bit = 0;
    RK_U32 hw_bit = 0;

    hal_jpege_dbg_func("enter hal %p\n", hal);

    if (ctx->dev) {
        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, NULL);
        if (ret)
            mpp_err_f("poll cmd failed %d\n", ret);
    }

    val = regs[1];
    hal_jpege_dbg_output("hw_status %08x\n", val);
    feedback->hw_status = val & 0x70;
    val = regs[24];

    sw_bit = jpege_bits_get_bitpos(bits);
    hw_bit = val;

    // NOTE: hardware will return 64 bit access byte count
    feedback->stream_length = ((sw_bit / 8) & (~0x7)) + hw_bit / 8;
    task->length = feedback->stream_length;
    task->hw_length = task->length - ctx->hal_start_pos;
    hal_jpege_dbg_output("stream bit: sw %d hw %d total %d hw_length %d\n",
                         sw_bit, hw_bit, feedback->stream_length, task->hw_length);

    hal_jpege_dbg_func("leave hal %p\n", hal);
    return ret;
}